

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hash.h
# Opt level: O2

pair<tsl::detail_robin_hash::robin_hash<unsigned_long,_tsl::robin_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_void,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::robin_iterator<false>,_bool>
 __thiscall
tsl::detail_robin_hash::
robin_hash<unsigned_long,tsl::robin_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,void,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>,false,tsl::rh::power_of_two_growth_policy<2ul>>
::insert_impl<unsigned_long,unsigned_long_const&>
          (robin_hash<unsigned_long,tsl::robin_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,void,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>,false,tsl::rh::power_of_two_growth_policy<2ul>>
           *this,unsigned_long *key,unsigned_long *value_type_args)

{
  bool bVar1;
  robin_iterator<false> rVar2;
  long lVar3;
  unsigned_long extraout_RDX;
  unsigned_long uVar4;
  undefined8 uVar5;
  size_t ibucket;
  unsigned_long uVar6;
  distance_type curr_dist_from_ideal_bucket;
  long lVar7;
  pair<tsl::detail_robin_hash::robin_hash<unsigned_long,_tsl::robin_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_void,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::robin_iterator<false>,_bool>
  pVar8;
  
  uVar4 = *key;
  curr_dist_from_ideal_bucket = 0;
  uVar6 = uVar4;
  do {
    ibucket = uVar6 & *(ulong *)this;
    if (*(short *)(*(long *)(this + 0x20) + ibucket * 0x10) < curr_dist_from_ideal_bucket) {
      while (bVar1 = robin_hash<unsigned_long,_tsl::robin_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_void,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                     ::rehash_on_extreme_load
                               ((robin_hash<unsigned_long,_tsl::robin_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_void,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                                 *)this,curr_dist_from_ideal_bucket), bVar1) {
        uVar6 = uVar4;
        for (curr_dist_from_ideal_bucket = 0; ibucket = uVar6 & *(ulong *)this,
            curr_dist_from_ideal_bucket <= *(short *)(*(long *)(this + 0x20) + ibucket * 0x10);
            curr_dist_from_ideal_bucket = curr_dist_from_ideal_bucket + 1) {
          uVar6 = ibucket + 1;
        }
      }
      lVar3 = *(long *)(this + 0x20);
      lVar7 = ibucket * 0x10;
      if (*(short *)(lVar3 + lVar7) == -1) {
        uVar4 = *value_type_args;
        *(unsigned_long *)((distance_type *)(lVar3 + lVar7) + 4) = uVar4;
        *(distance_type *)(lVar3 + lVar7) = curr_dist_from_ideal_bucket;
      }
      else {
        insert_value<unsigned_long_const&>
                  (this,ibucket,curr_dist_from_ideal_bucket,(truncated_hash_type)uVar4,
                   value_type_args);
        lVar3 = *(long *)(this + 0x20);
        uVar4 = extraout_RDX;
      }
      *(long *)(this + 0x30) = *(long *)(this + 0x30) + 1;
      rVar2.m_bucket = (bucket_entry_ptr)(lVar3 + lVar7);
      uVar5 = CONCAT71((int7)(uVar4 >> 8),1);
LAB_0015f835:
      pVar8._8_8_ = uVar5;
      pVar8.first.m_bucket = rVar2.m_bucket;
      return pVar8;
    }
    rVar2.m_bucket = (bucket_entry_ptr)(ibucket * 0x10 + *(long *)(this + 0x20));
    if (*(unsigned_long *)(rVar2.m_bucket)->m_value == uVar4) {
      uVar5 = 0;
      goto LAB_0015f835;
    }
    uVar6 = ibucket + 1;
    curr_dist_from_ideal_bucket = curr_dist_from_ideal_bucket + 1;
  } while( true );
}

Assistant:

std::pair<iterator, bool> insert_impl(const K& key,
                                        Args&&... value_type_args) {
    const std::size_t hash = hash_key(key);

    std::size_t ibucket = bucket_for_hash(hash);
    distance_type dist_from_ideal_bucket = 0;

    while (dist_from_ideal_bucket <=
           m_buckets[ibucket].dist_from_ideal_bucket()) {
      if ((!USE_STORED_HASH_ON_LOOKUP ||
           m_buckets[ibucket].bucket_hash_equal(hash)) &&
          compare_keys(KeySelect()(m_buckets[ibucket].value()), key)) {
        return std::make_pair(iterator(m_buckets + ibucket), false);
      }

      ibucket = next_bucket(ibucket);
      dist_from_ideal_bucket++;
    }

    while (rehash_on_extreme_load(dist_from_ideal_bucket)) {
      ibucket = bucket_for_hash(hash);
      dist_from_ideal_bucket = 0;

      while (dist_from_ideal_bucket <=
             m_buckets[ibucket].dist_from_ideal_bucket()) {
        ibucket = next_bucket(ibucket);
        dist_from_ideal_bucket++;
      }
    }

    if (m_buckets[ibucket].empty()) {
      m_buckets[ibucket].set_value_of_empty_bucket(
          dist_from_ideal_bucket, bucket_entry::truncate_hash(hash),
          std::forward<Args>(value_type_args)...);
    } else {
      insert_value(ibucket, dist_from_ideal_bucket,
                   bucket_entry::truncate_hash(hash),
                   std::forward<Args>(value_type_args)...);
    }

    m_nb_elements++;
    /*
     * The value will be inserted in ibucket in any case, either because it was
     * empty or by stealing the bucket (robin hood).
     */
    return std::make_pair(iterator(m_buckets + ibucket), true);
  }